

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

uint32_t __thiscall booster::locale::gnu_gettext::mo_file::get(mo_file *this,uint offset)

{
  undefined8 uVar1;
  uint in_ESI;
  mo_file *in_RDI;
  uint32_t tmp;
  string *s;
  undefined1 local_31 [33];
  uint32_t local_10 [4];
  
  if (in_RDI->file_size_ - 4 < (ulong)in_ESI) {
    uVar1 = __cxa_allocate_exception(0x30);
    s = (string *)local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_31 + 1),"Bad mo-file format",(allocator *)s);
    runtime_error::runtime_error((runtime_error *)in_RDI,s);
    __cxa_throw(uVar1,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  local_10[0] = *(uint32_t *)(in_RDI->data_ + in_ESI);
  convert(in_RDI,local_10);
  return local_10[0];
}

Assistant:

uint32_t get(unsigned offset) const
                {
                    uint32_t tmp;
                    if(offset > file_size_ - 4) {
                        throw booster::runtime_error("Bad mo-file format");
                    }
                    memcpy(&tmp,data_ + offset,4);
                    convert(tmp);
                    return tmp;
                }